

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int binsert(bstring b1,int pos,bstring b2,uchar fill)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bstring b;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  if ((b2 == (bstring)0x0 || b1 == (bstring)0x0) || pos < 0) {
    return -1;
  }
  uVar6 = b1->slen;
  if ((int)uVar6 < 0) {
    return -1;
  }
  iVar2 = b2->slen;
  if (iVar2 < 0) {
    return -1;
  }
  uVar7 = b1->mlen;
  if ((int)uVar7 < 1 || (int)uVar7 < (int)uVar6) {
    return -1;
  }
  lVar5 = (long)b2->data - (long)b1->data;
  b = b2;
  if (lVar5 < (long)(ulong)uVar7 && -1 < lVar5) {
    b = bstrcpy(b2);
    if (b == (bstring)0x0) {
      return -1;
    }
    uVar6 = b1->slen;
    iVar2 = b->slen;
  }
  uVar7 = uVar6 + iVar2;
  uVar1 = pos + iVar2;
  if ((int)(uVar7 | uVar1) < 0) {
    iVar2 = -1;
    goto LAB_00119e5d;
  }
  if ((int)uVar6 < pos) {
    iVar2 = balloc(b1,uVar1 + 1);
    if (iVar2 != 0) {
LAB_00119de0:
      iVar2 = -1;
      goto LAB_00119e5d;
    }
    uVar4 = (ulong)b1->slen;
    uVar7 = uVar1;
    if (b1->slen < pos) {
      do {
        b1->data[uVar4] = fill;
        uVar4 = uVar4 + 1;
      } while ((uint)pos != uVar4);
    }
  }
  else {
    iVar3 = balloc(b1,uVar7 + 1);
    if (iVar3 != 0) goto LAB_00119de0;
    if ((uint)pos < uVar6) {
      lVar5 = (long)iVar2 + (ulong)uVar6;
      do {
        b1->data[lVar5 + -1] = b1->data[~(long)b->slen + lVar5];
        lVar5 = lVar5 + -1;
      } while ((int)uVar1 < lVar5);
    }
  }
  b1->slen = uVar7;
  if (0 < (long)b->slen) {
    memmove(b1->data + (uint)pos,b->data,(long)b->slen);
    uVar7 = b1->slen;
  }
  b1->data[(int)uVar7] = '\0';
  iVar2 = 0;
LAB_00119e5d:
  if (b != b2) {
    bdestroy(b);
  }
  return iVar2;
}

Assistant:

int binsert (bstring b1, int pos, const bstring b2, unsigned char fill) {
int d, i, l;
ptrdiff_t pd;
bstring aux = b2;

	if (pos < 0 || b1 == NULL || b2 == NULL || b1->slen < 0 || 
	    b2->slen < 0 || b1->mlen < b1->slen || b1->mlen <= 0) return BSTR_ERR;

	/* Aliasing case */
	if ((pd = (ptrdiff_t) (b2->data - b1->data)) >= 0 && pd < (ptrdiff_t) b1->mlen) {
		if (NULL == (aux = bstrcpy (b2))) return BSTR_ERR;
	}

	/* Compute the two possible end pointers */
	d = b1->slen + aux->slen;
	l = pos + aux->slen;
	if ((d|l) < 0)
    {
        if (aux != b2) bdestroy (aux);
        return BSTR_ERR;
    }

	if (l > d) {
		/* Inserting past the end of the string */
		if (balloc (b1, l + 1) != BSTR_OK) {
			if (aux != b2) bdestroy (aux);
			return BSTR_ERR;
		}
		for (d = b1->slen; d < pos; d++) b1->data[d] = fill;
		b1->slen = l;
	} else {
		/* Inserting in the middle of the string */
		if (balloc (b1, d + 1) != BSTR_OK) {
			if (aux != b2) bdestroy (aux);
			return BSTR_ERR;
		}
		for (i = d - 1; i >= l; i--) {
			b1->data[i] = b1->data[i - aux->slen];
		}
		b1->slen = d;
	}
	bBlockCopy (b1->data + pos, aux->data, aux->slen);
	b1->data[b1->slen] = (unsigned char) '\0';
	if (aux != b2) bdestroy (aux);
	return 0;
}